

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.h
# Opt level: O1

fio_str_info_s * fiobj_obj2cstr(fio_str_info_s *__return_storage_ptr__,FIOBJ o)

{
  char cVar1;
  fiobj_object_vtable_s *pfVar2;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  
  if (o != 0) {
    if ((o & 1) != 0) {
      fio_ltocstr(__return_storage_ptr__,(long)o >> 1);
      return __return_storage_ptr__;
    }
    uVar3 = (uint)o & 6;
    cVar1 = '(';
    switch(uVar3) {
    case 0:
switchD_001470bb_caseD_0:
      cVar1 = *(char *)(o & 0xfffffffffffffff8);
switchD_001470bb_caseD_2:
      switch(cVar1) {
      case '\'':
        pfVar2 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        pfVar2 = &FIOBJECT_VTABLE_STRING;
        break;
      case ')':
        pfVar2 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        pfVar2 = &FIOBJECT_VTABLE_HASH;
        break;
      case '+':
        pfVar2 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar2 = &FIOBJECT_VTABLE_NUMBER;
      }
      (*pfVar2->to_str)(__return_storage_ptr__,o);
      return __return_storage_ptr__;
    case 2:
      goto switchD_001470bb_caseD_2;
    case 4:
switchD_001470bb_caseD_4:
      cVar1 = '*';
      goto switchD_001470bb_caseD_2;
    }
    if ((char)o == '&') {
      __return_storage_ptr__->data = anon_var_dwarf_21a;
      uVar5 = 5;
      goto LAB_001470fe;
    }
    uVar4 = (uint)o & 0xff;
    if (uVar4 == 0x16) {
      __return_storage_ptr__->data = anon_var_dwarf_225;
      uVar5 = 4;
      goto LAB_001470fe;
    }
    if (uVar4 != 6) {
      switch(uVar3) {
      case 0:
        goto switchD_001470bb_caseD_0;
      case 4:
        goto switchD_001470bb_caseD_4;
      case 6:
        cVar1 = (char)o;
      }
      goto switchD_001470bb_caseD_2;
    }
  }
  __return_storage_ptr__->data = anon_var_dwarf_20f;
  uVar5 = 4;
LAB_001470fe:
  *(undefined4 *)&__return_storage_ptr__->capa = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->capa + 4) = 0;
  *(undefined4 *)&__return_storage_ptr__->len = uVar5;
  *(undefined4 *)((long)&__return_storage_ptr__->len + 4) = 0;
  return __return_storage_ptr__;
}

Assistant:

FIO_INLINE fio_str_info_s fiobj_obj2cstr(const FIOBJ o) {
  if (!o) {
    fio_str_info_s ret = {0, 4, (char *)"null"};
    return ret;
  }
  if (o & FIOBJECT_NUMBER_FLAG)
    return fio_ltocstr(((intptr_t)o) >> 1);
  if ((o & FIOBJECT_PRIMITIVE_FLAG) == FIOBJECT_PRIMITIVE_FLAG) {
    switch ((fiobj_type_enum)o) {
    case FIOBJ_T_NULL: {
      fio_str_info_s ret = {0, 4, (char *)"null"};
      return ret;
    }
    case FIOBJ_T_FALSE: {
      fio_str_info_s ret = {0, 5, (char *)"false"};
      return ret;
    }
    case FIOBJ_T_TRUE: {
      fio_str_info_s ret = {0, 4, (char *)"true"};
      return ret;
    }
    default:
      break;
    }
  }
  return FIOBJECT2VTBL(o)->to_str(o);
}